

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O2

error assemble_int(context *ctx,opcode *op,token *token,int bits,int address)

{
  long lVar1;
  undefined4 in_register_0000000c;
  undefined8 *min;
  byte in_R9B;
  error *tmpres___LINE__;
  uint64_t value;
  token local_58;
  
  min = (undefined8 *)CONCAT44(in_register_0000000c,bits);
  lVar1 = 1L << ((byte)address - 1 & 0x3f);
  convert_integer((token *)ctx,(int64_t)min,-lVar1,(uint64_t *)(lVar1 + -1));
  if (ctx->pc == 0) {
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)ctx);
    opcode::add_bits((opcode *)token,(~(-1L << ((byte)address & 0x3f)) & value) << (in_R9B & 0x3f));
    context::tokenize(&local_58,(context *)op);
    *(int *)(min + 4) = local_58.column;
    min[2] = local_58.data.string._M_str;
    min[3] = local_58._24_8_;
    *min = local_58.filename;
    *(token_predicate *)(min + 1) = local_58.data.predicate;
    ctx->pc = 0;
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

inline error assemble_int(context& ctx, opcode& op, token& token, int bits, int address)
{
    const int raw_bits = bits - 1;
    const int64_t min = -(1LL << raw_bits);
    const int64_t max = (1LL << raw_bits) - 1;
    uint64_t value;
    CHECK(convert_integer(token, min, max, &value));
    const uint64_t raw = value & ((1ULL << bits) - 1);
    op.add_bits(raw << address);
    token = ctx.tokenize();
    return {};
}